

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O0

double __thiscall wasm::Random::getDouble(Random *this)

{
  int64_t init;
  double dVar1;
  Literal local_28;
  Random *local_10;
  Random *this_local;
  
  local_10 = this;
  init = get64(this);
  wasm::Literal::Literal(&local_28,init);
  dVar1 = wasm::Literal::reinterpretf64(&local_28);
  ::wasm::Literal::~Literal(&local_28);
  return dVar1;
}

Assistant:

double Random::getDouble() { return Literal(get64()).reinterpretf64(); }